

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

void player_update_light(player *p)

{
  int iVar1;
  uint32_t *puVar2;
  short sVar3;
  _Bool _Var4;
  _Bool _Var5;
  wchar_t wVar6;
  object *obj;
  short sVar7;
  _Bool dummy;
  object *burnt;
  _Bool local_29;
  object *local_28;
  
  obj = equipped_item_by_slot_name(p,"light");
  if (obj != (object *)0x0) {
    _Var4 = tval_is_light(obj);
    if (_Var4) {
      wVar6 = level_topography((int)p->place);
      if (wVar6 == L'\a') {
        _Var4 = false;
      }
      else {
        _Var4 = is_daytime();
      }
      _Var5 = flag_has_dbg(obj->flags,6,0x19,"obj->flags","OF_NO_FUEL");
      if (!_Var5 && _Var4 == false) {
        sVar3 = obj->timeout;
        if (0 < sVar3) {
          iVar1 = sVar3 + -1;
          sVar7 = (short)iVar1;
          obj->timeout = sVar7;
          if ((sVar3 < 0x65) ||
             (((uint)(iVar1 * -0x3d70a3d7) >> 2 | iVar1 * 0x40000000) < 0x28f5c29)) {
            puVar2 = &p->upkeep->redraw;
            *puVar2 = *puVar2 | 0x40000;
          }
          if (p->timed[2] == 0) {
            if (sVar7 == 0) {
              disturb(p);
              msg("Your light has gone out!");
              _Var4 = flag_has_dbg(obj->flags,6,0x17,"obj->flags","OF_BURNS_OUT");
              if (_Var4) {
                local_28 = gear_object_for_use(p,obj,L'\x01',false,&local_29);
                if (local_28->known != (object *)0x0) {
                  object_delete((chunk *)p->cave,(chunk *)0x0,&local_28->known);
                }
                object_delete((chunk *)cave,(chunk *)p->cave,&local_28);
              }
            }
            else if ((sVar3 < 0x33) && ((int)sVar7 + ((int)sVar7 / 0x14) * -0x14 == 0)) {
              disturb(p);
              msg("Your light is growing faint.");
            }
          }
          else if (sVar7 == 0) {
            obj->timeout = 1;
          }
        }
      }
    }
  }
  puVar2 = &p->upkeep->update;
  *puVar2 = *puVar2 | 2;
  return;
}

Assistant:

void player_update_light(struct player *p)
{
	/* Check for light being wielded */
	struct object *obj = equipped_item_by_slot_name(p, "light");

	/* Burn some fuel in the current light */
	if (obj && tval_is_light(obj)) {
		bool burn_fuel = true;

		/* Turn off the wanton burning of light during the day when not in a dungeon */
		if (level_topography(p->place) != TOP_CAVE && is_daytime())
			burn_fuel = false;

		/* If the light has the NO_FUEL flag, well... */
		if (of_has(obj->flags, OF_NO_FUEL))
		    burn_fuel = false;

		/* Use some fuel (except on artifacts, or during the day) */
		if (burn_fuel && obj->timeout > 0) {
			/* Decrease life-span */
			obj->timeout--;

			/* Hack -- notice interesting fuel steps */
			if ((obj->timeout < 100) || (!(obj->timeout % 100)))
				/* Redraw stuff */
				p->upkeep->redraw |= (PR_EQUIP);

			/* Hack -- Special treatment when blind */
			if (p->timed[TMD_BLIND]) {
				/* Hack -- save some light for later */
				if (obj->timeout == 0) obj->timeout++;
			} else if (obj->timeout == 0) {
				/* The light is now out */
				disturb(p);
				msg("Your light has gone out!");

				/* If it's a torch, now is the time to delete it */
				if (of_has(obj->flags, OF_BURNS_OUT)) {
					bool dummy;
					struct object *burnt =
						gear_object_for_use(p, obj, 1,
						false, &dummy);
					if (burnt->known)
						object_delete(p->cave, NULL, &burnt->known);
					object_delete(cave, p->cave, &burnt);
				}
			} else if ((obj->timeout < 50) && (!(obj->timeout % 20))) {
				/* The light is getting dim */
				disturb(p);
				msg("Your light is growing faint.");
			}
		}
	}

	/* Calculate torch radius */
	p->upkeep->update |= (PU_TORCH);
}